

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O2

size_t qHash(QJsonArray *array,size_t seed)

{
  QCborContainerPrivate *pQVar1;
  unsigned_long uVar2;
  long lVar3;
  
  pQVar1 = (array->a).d.ptr;
  if (pQVar1 == (QCborContainerPrivate *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = (pQVar1->elements).d.size * 2;
  }
  uVar2 = std::accumulate<QJsonArray::const_iterator,unsigned_long,QtPrivate::QHashCombine>
                    (array,0,array,lVar3,seed);
  return uVar2;
}

Assistant:

size_t qHash(const QJsonArray &array, size_t seed)
{
    return qHashRange(array.begin(), array.end(), seed);
}